

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int Test_SUNMatScaleAddI2(SUNMatrix A,N_Vector x,N_Vector y)

{
  uint uVar1;
  int iVar2;
  SUNMatrix B_00;
  N_Vector y_00;
  N_Vector z_00;
  SUNMatrix B_01;
  SUNMatrix B_02;
  realtype tol;
  N_Vector z;
  N_Vector w;
  SUNMatrix D;
  SUNMatrix C;
  SUNMatrix B;
  int failure;
  N_Vector y_local;
  N_Vector x_local;
  SUNMatrix A_local;
  
  B_00 = SUNMatClone(A);
  y_00 = N_VClone(x);
  z_00 = N_VClone(x);
  uVar1 = SUNMatCopy(A,B_00);
  if (uVar1 == 0) {
    uVar1 = SUNMatScaleAddI(-1.0,B_00);
    if (uVar1 == 0) {
      uVar1 = SUNMatMatvec(B_00,x,y_00);
      if (uVar1 == 0) {
        N_VLinearSum(1.0,x,-1.0,y,z_00);
        iVar2 = check_vector(y_00,z_00,2.220446049250313e-14);
        if (iVar2 == 0) {
          printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n");
          B_01 = SUNMatClone(A);
          SUNSparseMatrix_Reallocate(B_01,*(long *)((long)A->content + 0x10) + *A->content);
          uVar1 = SUNMatCopy(A,B_01);
          if (uVar1 == 0) {
            uVar1 = SUNMatScaleAddI(-1.0,B_01);
            if (uVar1 == 0) {
              uVar1 = SUNMatMatvec(B_01,x,y_00);
              if (uVar1 == 0) {
                N_VLinearSum(1.0,x,-1.0,y,z_00);
                iVar2 = check_vector(y_00,z_00,2.220446049250313e-14);
                if (iVar2 == 0) {
                  printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n");
                  B_02 = SUNMatClone(B_01);
                  uVar1 = SUNMatCopy(B_01,B_02);
                  if (uVar1 == 0) {
                    uVar1 = SUNMatScaleAddI(-1.0,B_02);
                    if (uVar1 == 0) {
                      uVar1 = SUNMatMatvec(B_02,x,y_00);
                      if (uVar1 == 0) {
                        iVar2 = check_vector(y_00,y,2.220446049250313e-14);
                        if (iVar2 == 0) {
                          printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n");
                          SUNMatDestroy(B_00);
                          SUNMatDestroy(B_01);
                          SUNMatDestroy(B_02);
                          N_VDestroy(y_00);
                          N_VDestroy(z_00);
                          A_local._4_4_ = 0;
                        }
                        else {
                          printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
                          printf("\nA =\n");
                          SUNSparseMatrix_Print(A,_stdout);
                          printf("\nD =\n");
                          SUNSparseMatrix_Print(B_02,_stdout);
                          printf("\nz =\n");
                          N_VPrint_Serial(y_00);
                          printf("\ny =\n");
                          N_VPrint_Serial(y);
                          SUNMatDestroy(B_00);
                          SUNMatDestroy(B_01);
                          SUNMatDestroy(B_02);
                          N_VDestroy(y_00);
                          N_VDestroy(z_00);
                          A_local._4_4_ = 1;
                        }
                      }
                      else {
                        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                        SUNMatDestroy(B_00);
                        SUNMatDestroy(B_01);
                        SUNMatDestroy(B_02);
                        N_VDestroy(y_00);
                        N_VDestroy(z_00);
                        A_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
                      SUNMatDestroy(B_00);
                      SUNMatDestroy(B_01);
                      SUNMatDestroy(B_02);
                      N_VDestroy(y_00);
                      N_VDestroy(z_00);
                      A_local._4_4_ = 1;
                    }
                  }
                  else {
                    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
                    SUNMatDestroy(B_00);
                    SUNMatDestroy(B_01);
                    SUNMatDestroy(B_02);
                    N_VDestroy(y_00);
                    N_VDestroy(z_00);
                    A_local._4_4_ = 1;
                  }
                }
                else {
                  printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
                  printf("\nA =\n");
                  SUNSparseMatrix_Print(A,_stdout);
                  printf("\nC =\n");
                  SUNSparseMatrix_Print(B_01,_stdout);
                  printf("\nz =\n");
                  N_VPrint_Serial(y_00);
                  printf("\nw =\n");
                  N_VPrint_Serial(z_00);
                  SUNMatDestroy(B_00);
                  SUNMatDestroy(B_01);
                  N_VDestroy(y_00);
                  N_VDestroy(z_00);
                  A_local._4_4_ = 1;
                }
              }
              else {
                printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
                SUNMatDestroy(B_00);
                SUNMatDestroy(B_01);
                N_VDestroy(y_00);
                N_VDestroy(z_00);
                A_local._4_4_ = 1;
              }
            }
            else {
              printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
              SUNMatDestroy(B_00);
              SUNMatDestroy(B_01);
              N_VDestroy(y_00);
              N_VDestroy(z_00);
              A_local._4_4_ = 1;
            }
          }
          else {
            printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_01);
            N_VDestroy(y_00);
            N_VDestroy(z_00);
            A_local._4_4_ = 1;
          }
        }
        else {
          printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
          printf("\nA =\n");
          SUNSparseMatrix_Print(A,_stdout);
          printf("\nB =\n");
          SUNSparseMatrix_Print(B_00,_stdout);
          printf("\nz =\n");
          N_VPrint_Serial(y_00);
          printf("\nw =\n");
          N_VPrint_Serial(z_00);
          SUNMatDestroy(B_00);
          N_VDestroy(y_00);
          N_VDestroy(z_00);
          A_local._4_4_ = 1;
        }
      }
      else {
        printf(">>> FAILED test -- SUNMatMatvec returned %d \n",(ulong)uVar1);
        SUNMatDestroy(B_00);
        N_VDestroy(y_00);
        N_VDestroy(z_00);
        A_local._4_4_ = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",(ulong)uVar1);
      SUNMatDestroy(B_00);
      N_VDestroy(y_00);
      N_VDestroy(z_00);
      A_local._4_4_ = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar1);
    SUNMatDestroy(B_00);
    N_VDestroy(y_00);
    N_VDestroy(z_00);
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatScaleAddI2(SUNMatrix A, N_Vector x, N_Vector y)
{
  int       failure;
  SUNMatrix B, C, D;
  N_Vector  w, z;
  realtype  tol=100*UNIT_ROUNDOFF;

  /* create clones for test */
  B = SUNMatClone(A);
  z = N_VClone(x);
  w = N_VClone(x);

  /* test 1: add I to a matrix with insufficient storage */
  failure = SUNMatCopy(A, B);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, B);   /* B = I-A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(B, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  N_VLinearSum(ONE,x,NEG_ONE,y,w);
  failure = check_vector(z, w, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 1 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nB =\n");
    SUNSparseMatrix_Print(B,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);  N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 1 \n");
  }

  /* test 2: add I to a matrix with sufficient but misplaced
     storage */
  C = SUNMatClone(A);
  failure = SUNSparseMatrix_Reallocate(C, SM_NNZ_S(A)+SM_ROWS_S(A));
  failure = SUNMatCopy(A, C);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, C);   /* C = I-A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(C, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  N_VLinearSum(ONE,x,NEG_ONE,y,w);
  failure = check_vector(z, w, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 2 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nC =\n");
    SUNSparseMatrix_Print(C,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\nw =\n");
    N_VPrint_Serial(w);
    SUNMatDestroy(B);  SUNMatDestroy(C);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 2 \n");
  }


  /* test 3: add I to a matrix with appropriate structure already in place */
  D = SUNMatClone(C);
  failure = SUNMatCopy(C, D);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatScaleAddI(NEG_ONE, D);   /* D = A */
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = SUNMatMatvec(D, x, z);
  if (failure) {
    printf(">>> FAILED test -- SUNMatMatvec returned %d \n",
           failure);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  failure = check_vector(z, y, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAddI2 check 3 \n");
    printf("\nA =\n");
    SUNSparseMatrix_Print(A,stdout);
    printf("\nD =\n");
    SUNSparseMatrix_Print(D,stdout);
    printf("\nz =\n");
    N_VPrint_Serial(z);
    printf("\ny =\n");
    N_VPrint_Serial(y);
    SUNMatDestroy(B);  SUNMatDestroy(C);  SUNMatDestroy(D);
    N_VDestroy(z);  N_VDestroy(w);  return(1);
  }
  else {
    printf("    PASSED test -- SUNMatScaleAddI2 check 3 \n");
  }

  SUNMatDestroy(B);
  SUNMatDestroy(C);
  SUNMatDestroy(D);
  N_VDestroy(z);
  N_VDestroy(w);
  return(0);
}